

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patomic-sync.c
# Opt level: O0

pint p_atomic_int_get(pint *atomic)

{
  pint *atomic_local;
  
  return *atomic;
}

Assistant:

P_LIB_API pint
p_atomic_int_get (const volatile pint *atomic)
{
#ifdef P_CC_CRAY
	__builtin_ia32_mfence ();
#else
	__sync_synchronize ();
#endif
	return *atomic;
}